

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

RPCHelpMan * submitpackage(void)

{
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  RPCMethodImpl fun;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_14;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  undefined4 in_stack_ffffffffffffe728;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe72c;
  _Alloc_hider _Var10;
  undefined4 uVar11;
  undefined1 in_stack_ffffffffffffe730 [24];
  undefined8 in_stack_ffffffffffffe748;
  undefined8 in_stack_ffffffffffffe750;
  _Manager_type in_stack_ffffffffffffe758;
  undefined8 in_stack_ffffffffffffe760;
  undefined1 in_stack_ffffffffffffe768 [16];
  pointer in_stack_ffffffffffffe778;
  pointer pRVar12;
  pointer in_stack_ffffffffffffe780;
  pointer pRVar13;
  pointer in_stack_ffffffffffffe788;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe790;
  undefined1 in_stack_ffffffffffffe798 [16];
  pointer in_stack_ffffffffffffe7a8;
  undefined8 in_stack_ffffffffffffe7b0;
  pointer in_stack_ffffffffffffe7b8;
  pointer pRVar15;
  pointer in_stack_ffffffffffffe7c0;
  pointer pRVar16;
  pointer in_stack_ffffffffffffe7c8;
  pointer pRVar17;
  _Invoker_type in_stack_ffffffffffffe7d0;
  pointer in_stack_ffffffffffffe7d8;
  pointer in_stack_ffffffffffffe7e0;
  pointer in_stack_ffffffffffffe7e8;
  undefined1 in_stack_ffffffffffffe7f0 [32];
  undefined8 in_stack_ffffffffffffe810;
  pointer in_stack_ffffffffffffe818;
  pointer in_stack_ffffffffffffe820;
  allocator<char> local_17c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_17c8;
  allocator<char> local_17a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_17a8;
  allocator<char> local_178a;
  allocator<char> local_1789;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1788;
  allocator<char> local_176a;
  allocator<char> local_1769;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1768;
  allocator<char> local_174a;
  allocator<char> local_1749;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1748;
  allocator<char> local_172a;
  allocator<char> local_1729;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1728;
  allocator<char> local_170a;
  allocator<char> local_1709;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1708;
  allocator<char> local_16ea;
  allocator<char> local_16e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16e8;
  allocator<char> local_16c2;
  allocator<char> local_16c1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16c0;
  allocator<char> local_16a2;
  allocator<char> local_16a1;
  RPCResults local_16a0;
  allocator_type local_1686;
  allocator<char> local_1685;
  allocator<char> local_1684;
  allocator_type local_1683;
  allocator<char> local_1682;
  allocator<char> local_1681;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1680;
  allocator<char> local_1662;
  allocator<char> local_1661;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1660;
  allocator<char> local_1642;
  allocator<char> local_1641;
  string local_1640;
  string local_1620;
  string local_1600;
  string local_15e0;
  string local_15c0;
  string local_15a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580;
  char *local_1560;
  size_type local_1558;
  char local_1550 [8];
  undefined8 uStack_1548;
  string local_1540 [32];
  string local_1520 [32];
  RPCResult local_1500;
  string local_1478 [32];
  string local_1458 [32];
  string local_1438 [32];
  string local_1418 [32];
  string local_13f8 [32];
  string local_13d8 [32];
  RPCResult local_13b8;
  string local_1330 [32];
  string local_1310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d0;
  string local_12b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1290;
  string local_1270 [32];
  RPCResult local_1250 [3];
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [8];
  undefined8 local_1030;
  string local_1018 [32];
  string local_ff8 [32];
  string local_fd8 [32];
  RPCResult local_fb8 [4];
  RPCResult local_d98;
  string local_d10 [32];
  string local_cf0 [32];
  RPCResult local_cd0;
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  RPCResult local_bc8 [3];
  string local_a30 [32];
  string local_a10 [32];
  RPCResult local_9f0;
  RPCArgOptions local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  string local_8e0;
  UniValue local_8c0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_868;
  string local_808 [32];
  RPCArgOptions local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  string local_760;
  UniValue local_740;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_6e8;
  string local_688 [32];
  RPCArgOptions local_668;
  RPCArgOptions local_620;
  string local_5d8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5b8;
  undefined1 local_560;
  string local_558 [32];
  RPCArg local_538;
  string local_430 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  string local_3b0 [32];
  RPCArg local_390 [3];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"submitpackage",&local_1641);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Submit a package of raw transactions (serialized, hex-encoded) to local node.\nThe package will be validated according to consensus and mempool policy rules. If any transaction passes, it will be accepted to mempool.\nThis RPC is experimental and the interface may be unstable. Refer to doc/policy/packages.md for documentation on package policies.\nWarning: successful submission does not mean the transactions will propagate throughout the network.\n"
             ,&local_1642);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"package",&local_1661);
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,
             "An array of raw transactions.\nThe package must solely consist of a child and its parents. None of the parents may depend on each other.\nThe package must be topologically sorted, with the child being the last element in the array."
             ,&local_1662);
  std::__cxx11::string::string<std::allocator<char>>(local_558,"rawtx",&local_1681);
  local_5b8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_560 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"",&local_1682);
  local_620.oneline_description._M_dataplus._M_p = (pointer)&local_620.oneline_description.field_2;
  local_620.skip_type_check = false;
  local_620.oneline_description._M_string_length = 0;
  local_620.oneline_description.field_2._M_local_buf[0] = '\0';
  local_620.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_620.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_620.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_620.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_620._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe72c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe728;
  name._M_string_length = in_stack_ffffffffffffe730._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffe730._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe750;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe748;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe758;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe760;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe768;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe778;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe780;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe788;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe790;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe798;
  description_15._M_string_length = in_stack_ffffffffffffe7b0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7b8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe7c0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7d0;
  opts._0_8_ = in_stack_ffffffffffffe7c8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe7d8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7e0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7e8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe7f0._0_24_;
  opts.hidden = (bool)in_stack_ffffffffffffe7f0[0x18];
  opts.also_positional = (bool)in_stack_ffffffffffffe7f0[0x19];
  opts._66_6_ = in_stack_ffffffffffffe7f0._26_6_;
  RPCArg::RPCArg(&local_538,name,(Type)local_558,fallback,description_15,opts);
  __l._M_len = 1;
  __l._M_array = &local_538;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1680,__l,&local_1683);
  local_668.oneline_description._M_dataplus._M_p = (pointer)&local_668.oneline_description.field_2;
  local_668.skip_type_check = false;
  local_668.oneline_description._M_string_length = 0;
  local_668.oneline_description.field_2._M_local_buf[0] = '\0';
  local_668.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_668.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_668.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_668.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_668._58_8_ = 0;
  _Var10._M_p = &local_668.skip_type_check;
  name_00._M_string_length = in_stack_ffffffffffffe730._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  name_00._M_dataplus._M_p = _Var10._M_p;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe750;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe748;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe758;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe760;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe768;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe778;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe780;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe788;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe790;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe798;
  description_16._M_string_length = in_stack_ffffffffffffe7b0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7b8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe7c0;
  inner_14.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7d0;
  inner_14.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe7c8;
  inner_14.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe7d8;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7e8;
  opts_02._0_8_ = in_stack_ffffffffffffe7e0;
  opts_02.oneline_description._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  opts_02.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe7f0._24_8_;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe810;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe818;
  opts_02._64_8_ = in_stack_ffffffffffffe820;
  RPCArg::RPCArg(local_390,name_00,(Type)local_3b0,fallback_00,description_16,inner_14,opts_02);
  std::__cxx11::string::string<std::allocator<char>>(local_688,"maxfeerate",&local_1684);
  FormatMoney_abi_cxx11_(&local_760,node::DEFAULT_MAX_RAW_TX_FEE_RATE);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_740,&local_760);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_6e8,&local_740);
  std::operator+(&local_7a0,
                 "Reject transactions whose fee rate is higher than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_780,&local_7a0,
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."
                );
  local_7e8.oneline_description._M_dataplus._M_p = (pointer)&local_7e8.oneline_description.field_2;
  local_7e8.skip_type_check = false;
  local_7e8.oneline_description._M_string_length = 0;
  local_7e8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_7e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_7e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_7e8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_7e8._58_8_ = 0;
  name_01._M_string_length = in_stack_ffffffffffffe730._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  name_01._M_dataplus._M_p = _Var10._M_p;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe750;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe748;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe758;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe760;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe768;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe778;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe780;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe788;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe790;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe798;
  description_17._M_string_length = in_stack_ffffffffffffe7b0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7b8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe7c0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7d0;
  opts_00._0_8_ = in_stack_ffffffffffffe7c8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe7d8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7e0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7e8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe7f0._0_24_;
  opts_00.hidden = (bool)in_stack_ffffffffffffe7f0[0x18];
  opts_00.also_positional = (bool)in_stack_ffffffffffffe7f0[0x19];
  opts_00._66_6_ = in_stack_ffffffffffffe7f0._26_6_;
  RPCArg::RPCArg(local_390 + 1,name_01,(Type)local_688,fallback_01,description_17,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_808,"maxburnamount",&local_1685);
  FormatMoney_abi_cxx11_(&local_8e0,0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_8c0,&local_8e0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_868,&local_8c0);
  std::operator+(&local_920,
                 "Reject transactions with provably unspendable outputs (e.g. \'datacarrier\' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_900,&local_920,
                 ".\nIf burning funds through unspendable outputs is desired, increase this value.\nThis check is based on heuristics and does not guarantee spendability of outputs.\n"
                );
  local_968.oneline_description._M_dataplus._M_p = (pointer)&local_968.oneline_description.field_2;
  local_968.skip_type_check = false;
  local_968.oneline_description._M_string_length = 0;
  local_968.oneline_description.field_2._M_local_buf[0] = '\0';
  local_968.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_968.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_968.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_968.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_968._58_8_ = 0;
  name_02._M_string_length = in_stack_ffffffffffffe730._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  name_02._M_dataplus._M_p = _Var10._M_p;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe750;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe748;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe758;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe760;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe768;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe778;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe780;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe788;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe790;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe798;
  description_18._M_string_length = in_stack_ffffffffffffe7b0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7b8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe7c0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7d0;
  opts_01._0_8_ = in_stack_ffffffffffffe7c8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe7d8;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7e0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7e8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe7f0._0_24_;
  opts_01.hidden = (bool)in_stack_ffffffffffffe7f0[0x18];
  opts_01.also_positional = (bool)in_stack_ffffffffffffe7f0[0x19];
  opts_01._66_6_ = in_stack_ffffffffffffe7f0._26_6_;
  RPCArg::RPCArg(local_390 + 2,name_02,(Type)local_808,fallback_02,description_18,opts_01);
  __l_00._M_len = 3;
  __l_00._M_array = local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1660,__l_00,&local_1686);
  std::__cxx11::string::string<std::allocator<char>>(local_a10,"",&local_16a1);
  std::__cxx11::string::string<std::allocator<char>>(local_a30,"",&local_16a2);
  std::__cxx11::string::string<std::allocator<char>>(local_be8,"package_msg",&local_16c1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c08,
             "The transaction package result message. \"success\" indicates all transactions were accepted into or are already in the mempool."
             ,&local_16c2);
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  m_key_name._M_dataplus._M_p = _Var10._M_p;
  description._M_string_length = in_stack_ffffffffffffe750;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe778;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult(local_bc8,STR,m_key_name,description,inner,SUB81(local_be8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c28,"tx-results",&local_16e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c48,"transaction results keyed by wtxid",&local_16ea);
  std::__cxx11::string::string<std::allocator<char>>(local_cf0,"wtxid",&local_1709);
  std::__cxx11::string::string<std::allocator<char>>(local_d10,"transaction wtxid",&local_170a);
  std::__cxx11::string::string<std::allocator<char>>(local_fd8,"txid",&local_1729);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ff8,"The transaction hash in hex",&local_172a);
  local_1748.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1748.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1748.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  m_key_name_00._M_dataplus._M_p = _Var10._M_p;
  description_00._M_string_length = in_stack_ffffffffffffe750;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult(local_fb8,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(local_fd8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1018,"other-wtxid",&local_1749);
  uVar11 = (undefined4)((ulong)_Var10._M_p >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1038,
             "The wtxid of a different transaction with the same txid but different witness found in the mempool. This means the submitted transaction was ignored."
             ,&local_174a);
  local_1768.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1768.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1768.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_24_ = in_stack_ffffffffffffe730;
  auVar1._0_4_ = uVar11;
  auVar1._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffe750;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_fb8 + 1,STR_HEX,(string)(auVar1 << 0x20),SUB81(local_1018,0),description_01,
             inner_01,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1058,"vsize",&local_1769);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1078,"Sigops-adjusted virtual transaction size.",&local_176a);
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1788.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar2._4_24_ = in_stack_ffffffffffffe730;
  auVar2._0_4_ = uVar11;
  auVar2._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffe750;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_fb8 + 2,NUM,(string)(auVar2 << 0x20),SUB81(local_1058,0),description_02,inner_02,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1098,"fees",&local_1789);
  std::__cxx11::string::string<std::allocator<char>>(local_10b8,"Transaction fees",&local_178a);
  std::__cxx11::string::string<std::allocator<char>>(local_1270,"base",&local_17a9);
  std::operator+(&local_1290,"transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  local_17c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_17c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  description_03._M_string_length = in_stack_ffffffffffffe750;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_1250,STR_AMOUNT,m_key_name_01,description_03,inner_03,SUB81(local_1270,0));
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,"effective-feerate",&local_17c9);
  std::operator+(&local_12f0,
                 "if the transaction was not already in the mempool, the effective feerate in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_12d0,&local_12f0,
                 " per KvB. For example, the package feerate and/or feerate with modified fees from prioritisetransaction."
                );
  uVar9 = 0;
  auVar3._4_24_ = in_stack_ffffffffffffe730;
  auVar3._0_4_ = uVar11;
  auVar3._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe750;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_1250 + 1,STR_AMOUNT,(string)(auVar3 << 0x20),SUB81(local_12b0,0),description_04,
             inner_04,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1310,"effective-includes",(allocator<char> *)&stack0xffffffffffffe817);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1330,
             "if effective-feerate is provided, the wtxids of the transactions whose fees and vsizes are included in effective-feerate."
             ,(allocator<char> *)&stack0xffffffffffffe816);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13d8,"",(allocator<char> *)&stack0xffffffffffffe7f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13f8,"transaction wtxid in hex",(allocator<char> *)&stack0xffffffffffffe7f6);
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  description_05._M_string_length = in_stack_ffffffffffffe750;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (&local_13b8,STR_HEX,m_key_name_02,description_05,inner_05,SUB81(local_13d8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_13b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7f8,__l_01,
             (allocator_type *)&stack0xffffffffffffe7d7);
  auVar4._4_24_ = in_stack_ffffffffffffe730;
  auVar4._0_4_ = uVar11;
  auVar4._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe750;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_1250 + 2,ARR,(string)(auVar4 << 0x20),SUB81(local_1310,0),description_06,inner_06
             ,true);
  __l_02._M_len = 3;
  __l_02._M_array = local_1250;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_17a8,__l_02,(allocator_type *)&stack0xffffffffffffe7d6);
  auVar5._4_24_ = in_stack_ffffffffffffe730;
  auVar5._0_4_ = uVar11;
  auVar5._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffe750;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_fb8 + 3,OBJ,(string)(auVar5 << 0x20),SUB81(local_1098,0),description_07,inner_07,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1418,"error",(allocator<char> *)&stack0xffffffffffffe7d5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1438,"The transaction error string, if it was rejected by the mempool",
             (allocator<char> *)&stack0xffffffffffffe7d4);
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  uVar9 = 0;
  auVar6._4_24_ = in_stack_ffffffffffffe730;
  auVar6._0_4_ = uVar11;
  auVar6._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe750;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (&local_d98,STR,(string)(auVar6 << 0x20),SUB81(local_1418,0),description_08,inner_08,
             true);
  __l_03._M_len = 5;
  __l_03._M_array = local_fb8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1728,__l_03,(allocator_type *)&stack0xffffffffffffe7b7);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  description_09._M_string_length = in_stack_ffffffffffffe750;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult(&local_cd0,OBJ,m_key_name_03,description_09,inner_09,SUB81(local_cf0,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_cd0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1708,__l_04,(allocator_type *)&stack0xffffffffffffe7b6);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  description_10._M_string_length = in_stack_ffffffffffffe750;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe778;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_bc8 + 1,OBJ_DYN,m_key_name_04,description_10,inner_10,SUB81(local_c28,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1458,"replaced-transactions",(allocator<char> *)&stack0xffffffffffffe7b5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1478,"List of txids of replaced transactions",
             (allocator<char> *)&stack0xffffffffffffe7b4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1520,"",(allocator<char> *)&stack0xffffffffffffe797);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1540,"The transaction id",(allocator<char> *)&stack0xffffffffffffe796);
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  description_11._M_string_length = in_stack_ffffffffffffe750;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (&local_1500,STR_HEX,m_key_name_05,description_11,inner_11,SUB81(local_1520,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1500;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe798,__l_05,
             (allocator_type *)&stack0xffffffffffffe777);
  uVar9 = 0;
  auVar7._4_24_ = in_stack_ffffffffffffe730;
  auVar7._0_4_ = uVar11;
  auVar7._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe750;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar12;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult
            (local_bc8 + 2,ARR,(string)(auVar7 << 0x20),SUB81(local_1458,0),description_12,inner_12,
             true);
  __l_06._M_len = 3;
  __l_06._M_array = local_bc8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_16c0,__l_06,(allocator_type *)&stack0xffffffffffffe776);
  m_key_name_06._M_dataplus._M_p._4_4_ = uVar11;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe730._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  description_13._M_string_length = in_stack_ffffffffffffe750;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe748;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe758;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe760;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar12;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe768._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe768._8_8_;
  RPCResult::RPCResult(&local_9f0,OBJ,m_key_name_06,description_13,inner_13,SUB81(local_a10,0));
  result._4_4_ = uVar11;
  result.m_type = uVar9;
  result.m_key_name._0_24_ = in_stack_ffffffffffffe730;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe748;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe750;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe758;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe760;
  result.m_optional = (bool)in_stack_ffffffffffffe768[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe768[1];
  result._66_6_ = in_stack_ffffffffffffe768._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe768._8_8_;
  result.m_description._M_string_length = (size_type)pRVar12;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar13;
  result.m_description.field_2._8_8_ = pRVar14;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe790;
  result.m_cond._8_16_ = in_stack_ffffffffffffe798;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffe7a8;
  RPCResults::RPCResults(&local_16a0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15c0,"submitpackage",(allocator<char> *)&stack0xffffffffffffe775);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15e0,"[\"rawtx1\", \"rawtx2\"]",
             (allocator<char> *)&stack0xffffffffffffe774);
  HelpExampleRpc(&local_15a0,&local_15c0,&local_15e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1620,"submitpackage",(allocator<char> *)&stack0xffffffffffffe773);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1640,"\'[\"rawtx1\", \"rawtx2\"]\'",
             (allocator<char> *)&stack0xffffffffffffe772);
  HelpExampleCli(&local_1600,&local_1620,&local_1640);
  std::operator+(&local_1580,&local_15a0,&local_1600);
  local_1560 = local_1550;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1580._M_dataplus._M_p == &local_1580.field_2) {
    uStack_1548 = local_1580.field_2._8_8_;
  }
  else {
    local_1560 = local_1580._M_dataplus._M_p;
  }
  local_1558 = local_1580._M_string_length;
  local_1580._M_string_length = 0;
  local_1580.field_2._M_local_buf[0] = '\0';
  name_03._M_string_length = in_stack_ffffffffffffe730._0_8_;
  name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe730._8_16_;
  name_03._M_dataplus._M_p = &stack0xffffffffffffe748;
  description_14.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:870:9)>
       ::_M_manager;
  description_14._M_dataplus._M_p = (pointer)0x0;
  description_14._M_string_length = 0;
  description_14.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:870:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe768._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe768._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe790;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe7a8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe798._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe798._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe7b0;
  fun.super__Function_base._M_functor._8_8_ = pRVar16;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar15;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar17;
  fun._M_invoker = in_stack_ffffffffffffe7d0;
  local_1580._M_dataplus._M_p = (pointer)&local_1580.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_03,description_14,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe748);
  std::__cxx11::string::~string((string *)&local_1560);
  std::__cxx11::string::~string((string *)&local_1580);
  std::__cxx11::string::~string((string *)&local_1600);
  std::__cxx11::string::~string((string *)&local_1640);
  std::__cxx11::string::~string((string *)&local_1620);
  std::__cxx11::string::~string((string *)&local_15a0);
  std::__cxx11::string::~string((string *)&local_15e0);
  std::__cxx11::string::~string((string *)&local_15c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a0.m_results);
  RPCResult::~RPCResult(&local_9f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16c0);
  lVar8 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_bc8[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe798);
  RPCResult::~RPCResult(&local_1500);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe778);
  std::__cxx11::string::~string(local_1540);
  std::__cxx11::string::~string(local_1520);
  std::__cxx11::string::~string(local_1478);
  std::__cxx11::string::~string(local_1458);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1708);
  RPCResult::~RPCResult(&local_cd0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1728);
  lVar8 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_fb8[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7b8);
  std::__cxx11::string::~string(local_1438);
  std::__cxx11::string::~string(local_1418);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17a8);
  lVar8 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1250[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7f8);
  RPCResult::~RPCResult(&local_13b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe7d8);
  std::__cxx11::string::~string(local_13f8);
  std::__cxx11::string::~string(local_13d8);
  std::__cxx11::string::~string(local_1330);
  std::__cxx11::string::~string(local_1310);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe818);
  std::__cxx11::string::~string((string *)&local_12d0);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::__cxx11::string::~string(local_12b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17c8);
  std::__cxx11::string::~string((string *)&local_1290);
  std::__cxx11::string::~string(local_1270);
  std::__cxx11::string::~string(local_10b8);
  std::__cxx11::string::~string(local_1098);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1788);
  std::__cxx11::string::~string(local_1078);
  std::__cxx11::string::~string(local_1058);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1768);
  std::__cxx11::string::~string(local_1038);
  std::__cxx11::string::~string(local_1018);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1748);
  std::__cxx11::string::~string(local_ff8);
  std::__cxx11::string::~string(local_fd8);
  std::__cxx11::string::~string(local_d10);
  std::__cxx11::string::~string(local_cf0);
  std::__cxx11::string::~string(local_c48);
  std::__cxx11::string::~string(local_c28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16e8);
  std::__cxx11::string::~string(local_c08);
  std::__cxx11::string::~string(local_be8);
  std::__cxx11::string::~string(local_a30);
  std::__cxx11::string::~string(local_a10);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1660);
  lVar8 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_390[0].m_names._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_968);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_868);
  UniValue::~UniValue(&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string(local_808);
  RPCArgOptions::~RPCArgOptions(&local_7e8);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_6e8);
  UniValue::~UniValue(&local_740);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string(local_688);
  RPCArgOptions::~RPCArgOptions(&local_668);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1680);
  RPCArg::~RPCArg(&local_538);
  RPCArgOptions::~RPCArgOptions(&local_620);
  std::__cxx11::string::~string(local_5d8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_5b8._M_first);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_430);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan submitpackage()
{
    return RPCHelpMan{"submitpackage",
        "Submit a package of raw transactions (serialized, hex-encoded) to local node.\n"
        "The package will be validated according to consensus and mempool policy rules. If any transaction passes, it will be accepted to mempool.\n"
        "This RPC is experimental and the interface may be unstable. Refer to doc/policy/packages.md for documentation on package policies.\n"
        "Warning: successful submission does not mean the transactions will propagate throughout the network.\n"
        ,
        {
            {"package", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of raw transactions.\n"
                "The package must solely consist of a child and its parents. None of the parents may depend on each other.\n"
                "The package must be topologically sorted, with the child being the last element in the array.",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
            {"maxburnamount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_BURN_AMOUNT)},
             "Reject transactions with provably unspendable outputs (e.g. 'datacarrier' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in " + CURRENCY_UNIT + ".\n"
             "If burning funds through unspendable outputs is desired, increase this value.\n"
             "This check is based on heuristics and does not guarantee spendability of outputs.\n"
            },
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "package_msg", "The transaction package result message. \"success\" indicates all transactions were accepted into or are already in the mempool."},
                {RPCResult::Type::OBJ_DYN, "tx-results", "transaction results keyed by wtxid",
                {
                    {RPCResult::Type::OBJ, "wtxid", "transaction wtxid", {
                        {RPCResult::Type::STR_HEX, "txid", "The transaction hash in hex"},
                        {RPCResult::Type::STR_HEX, "other-wtxid", /*optional=*/true, "The wtxid of a different transaction with the same txid but different witness found in the mempool. This means the submitted transaction was ignored."},
                        {RPCResult::Type::NUM, "vsize", /*optional=*/true, "Sigops-adjusted virtual transaction size."},
                        {RPCResult::Type::OBJ, "fees", /*optional=*/true, "Transaction fees", {
                            {RPCResult::Type::STR_AMOUNT, "base", "transaction fee in " + CURRENCY_UNIT},
                            {RPCResult::Type::STR_AMOUNT, "effective-feerate", /*optional=*/true, "if the transaction was not already in the mempool, the effective feerate in " + CURRENCY_UNIT + " per KvB. For example, the package feerate and/or feerate with modified fees from prioritisetransaction."},
                            {RPCResult::Type::ARR, "effective-includes", /*optional=*/true, "if effective-feerate is provided, the wtxids of the transactions whose fees and vsizes are included in effective-feerate.",
                                {{RPCResult::Type::STR_HEX, "", "transaction wtxid in hex"},
                            }},
                        }},
                        {RPCResult::Type::STR, "error", /*optional=*/true, "The transaction error string, if it was rejected by the mempool"},
                    }}
                }},
                {RPCResult::Type::ARR, "replaced-transactions", /*optional=*/true, "List of txids of replaced transactions",
                {
                    {RPCResult::Type::STR_HEX, "", "The transaction id"},
                }},
            },
        },
        RPCExamples{
            HelpExampleRpc("submitpackage", R"(["rawtx1", "rawtx2"])") +
            HelpExampleCli("submitpackage", R"('["rawtx1", "rawtx2"]')")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue raw_transactions = request.params[0].get_array();
            if (raw_transactions.size() < 2 || raw_transactions.size() > MAX_PACKAGE_COUNT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER,
                                   "Array must contain between 2 and " + ToString(MAX_PACKAGE_COUNT) + " transactions.");
            }

            // Fee check needs to be run with chainstate and package context
            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};
            std::optional<CFeeRate> client_maxfeerate{max_raw_tx_fee_rate};
            // 0-value is special; it's mapped to no sanity check
            if (max_raw_tx_fee_rate == CFeeRate(0)) {
                client_maxfeerate = std::nullopt;
            }

            // Burn sanity check is run with no context
            const CAmount max_burn_amount = request.params[2].isNull() ? 0 : AmountFromValue(request.params[2]);

            std::vector<CTransactionRef> txns;
            txns.reserve(raw_transactions.size());
            for (const auto& rawtx : raw_transactions.getValues()) {
                CMutableTransaction mtx;
                if (!DecodeHexTx(mtx, rawtx.get_str())) {
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR,
                                       "TX decode failed: " + rawtx.get_str() + " Make sure the tx has at least one input.");
                }

                for (const auto& out : mtx.vout) {
                    if((out.scriptPubKey.IsUnspendable() || !out.scriptPubKey.HasValidOps()) && out.nValue > max_burn_amount) {
                        throw JSONRPCTransactionError(TransactionError::MAX_BURN_EXCEEDED);
                    }
                }

                txns.emplace_back(MakeTransactionRef(std::move(mtx)));
            }
            if (!IsChildWithParentsTree(txns)) {
                throw JSONRPCTransactionError(TransactionError::INVALID_PACKAGE, "package topology disallowed. not child-with-parents or parents depend on each other.");
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            Chainstate& chainstate = EnsureChainman(node).ActiveChainstate();
            const auto package_result = WITH_LOCK(::cs_main, return ProcessNewPackage(chainstate, mempool, txns, /*test_accept=*/ false, client_maxfeerate));

            std::string package_msg = "success";

            // First catch package-wide errors, continue if we can
            switch(package_result.m_state.GetResult()) {
                case PackageValidationResult::PCKG_RESULT_UNSET:
                {
                    // Belt-and-suspenders check; everything should be successful here
                    CHECK_NONFATAL(package_result.m_tx_results.size() == txns.size());
                    for (const auto& tx : txns) {
                        CHECK_NONFATAL(mempool.exists(GenTxid::Txid(tx->GetHash())));
                    }
                    break;
                }
                case PackageValidationResult::PCKG_MEMPOOL_ERROR:
                {
                    // This only happens with internal bug; user should stop and report
                    throw JSONRPCTransactionError(TransactionError::MEMPOOL_ERROR,
                        package_result.m_state.GetRejectReason());
                }
                case PackageValidationResult::PCKG_POLICY:
                case PackageValidationResult::PCKG_TX:
                {
                    // Package-wide error we want to return, but we also want to return individual responses
                    package_msg = package_result.m_state.ToString();
                    CHECK_NONFATAL(package_result.m_tx_results.size() == txns.size() ||
                            package_result.m_tx_results.empty());
                    break;
                }
            }

            size_t num_broadcast{0};
            for (const auto& tx : txns) {
                // We don't want to re-submit the txn for validation in BroadcastTransaction
                if (!mempool.exists(GenTxid::Txid(tx->GetHash()))) {
                    continue;
                }

                // We do not expect an error here; we are only broadcasting things already/still in mempool
                std::string err_string;
                const auto err = BroadcastTransaction(node, tx, err_string, /*max_tx_fee=*/0, /*relay=*/true, /*wait_callback=*/true);
                if (err != TransactionError::OK) {
                    throw JSONRPCTransactionError(err,
                        strprintf("transaction broadcast failed: %s (%d transactions were broadcast successfully)",
                            err_string, num_broadcast));
                }
                num_broadcast++;
            }

            UniValue rpc_result{UniValue::VOBJ};
            rpc_result.pushKV("package_msg", package_msg);
            UniValue tx_result_map{UniValue::VOBJ};
            std::set<uint256> replaced_txids;
            for (const auto& tx : txns) {
                UniValue result_inner{UniValue::VOBJ};
                result_inner.pushKV("txid", tx->GetHash().GetHex());
                auto it = package_result.m_tx_results.find(tx->GetWitnessHash());
                if (it == package_result.m_tx_results.end()) {
                    // No results, report error and continue
                    result_inner.pushKV("error", "unevaluated");
                    continue;
                }
                const auto& tx_result = it->second;
                switch(it->second.m_result_type) {
                case MempoolAcceptResult::ResultType::DIFFERENT_WITNESS:
                    result_inner.pushKV("other-wtxid", it->second.m_other_wtxid.value().GetHex());
                    break;
                case MempoolAcceptResult::ResultType::INVALID:
                    result_inner.pushKV("error", it->second.m_state.ToString());
                    break;
                case MempoolAcceptResult::ResultType::VALID:
                case MempoolAcceptResult::ResultType::MEMPOOL_ENTRY:
                    result_inner.pushKV("vsize", int64_t{it->second.m_vsize.value()});
                    UniValue fees(UniValue::VOBJ);
                    fees.pushKV("base", ValueFromAmount(it->second.m_base_fees.value()));
                    if (tx_result.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                        // Effective feerate is not provided for MEMPOOL_ENTRY transactions even
                        // though modified fees is known, because it is unknown whether package
                        // feerate was used when it was originally submitted.
                        fees.pushKV("effective-feerate", ValueFromAmount(tx_result.m_effective_feerate.value().GetFeePerK()));
                        UniValue effective_includes_res(UniValue::VARR);
                        for (const auto& wtxid : tx_result.m_wtxids_fee_calculations.value()) {
                            effective_includes_res.push_back(wtxid.ToString());
                        }
                        fees.pushKV("effective-includes", std::move(effective_includes_res));
                    }
                    result_inner.pushKV("fees", std::move(fees));
                    for (const auto& ptx : it->second.m_replaced_transactions) {
                        replaced_txids.insert(ptx->GetHash());
                    }
                    break;
                }
                tx_result_map.pushKV(tx->GetWitnessHash().GetHex(), std::move(result_inner));
            }
            rpc_result.pushKV("tx-results", std::move(tx_result_map));
            UniValue replaced_list(UniValue::VARR);
            for (const uint256& hash : replaced_txids) replaced_list.push_back(hash.ToString());
            rpc_result.pushKV("replaced-transactions", std::move(replaced_list));
            return rpc_result;
        },
    };
}